

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O1

void deserialize_duplicate_keys(void)

{
  char data [17];
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 local_8;
  
  local_18 = 0x1303b;
  uStack_10 = 0;
  local_8 = 0;
  invalid_deserialize_test(&local_18,0x11,"overlapping keys");
  return;
}

Assistant:

DEFINE_TEST(deserialize_duplicate_keys) {
    // clang-format off
    const char data[] = {
        0x3B, 0x30, // Serial Cookie
        1, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        0, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        0, 0,       // Upper 16 bits of the second container - DUPLICATE
        0, 0,       // Cardinality - 1 of the second container
        0, 0,       // Only value of first container
        0, 0,       // Only value of second container
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "overlapping keys");
}